

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roboclaw.cpp
# Opt level: O0

bool __thiscall RoboClaw::GetDeadBand(RoboClaw *this,uint8_t *Min,uint8_t *Max)

{
  uint16_t uVar1;
  bool *in_RDX;
  undefined1 *in_RSI;
  RoboClaw *in_RDI;
  uint16_t value;
  bool valid;
  undefined1 local_19;
  
  uVar1 = Read2(in_RDI,(uint8_t)((ulong)in_RSI >> 0x38),(uint8_t)((ulong)in_RSI >> 0x30),in_RDX);
  if ((local_19 & 1) != 0) {
    *in_RSI = (char)(uVar1 >> 8);
    *in_RDX = SUB21(uVar1,0);
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool RoboClaw::GetDeadBand( uint8_t &Min, uint8_t &Max)
{
    bool valid;
    uint16_t value = Read2( m_address, GETDEADBAND,&valid);
    if(valid)
    {
        Min = value>>8;
        Max = value;
    }
    return valid;
}